

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_decoder.c
# Opt level: O0

lzma_ret lzma_block_decoder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_block *block)

{
  char cVar1;
  uint uVar2;
  uint32_t uVar3;
  lzma_vli lVar4;
  code *__dest;
  lzma_vli local_88;
  undefined1 local_78 [8];
  undefined8 local_70;
  _func_void_ptr_void_ptr_size_t_size_t *local_30;
  lzma_block_coder *coder;
  lzma_block *block_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder = (lzma_block_coder *)block;
  block_local = (lzma_block *)allocator;
  allocator_local = (lzma_allocator *)next;
  if ((code *)next->init != lzma_block_decoder_init) {
    lzma_next_end(next,allocator);
  }
  allocator_local->opaque = lzma_block_decoder_init;
  lVar4 = lzma_block_unpadded_size((lzma_block *)coder);
  if ((lVar4 == 0) ||
     ((0x7fffffffffffffff < (coder->next).init && ((coder->next).init != 0xffffffffffffffff)))) {
    next_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    local_30 = allocator_local->alloc;
    if (local_30 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
      local_30 = (_func_void_ptr_void_ptr_size_t_size_t *)
                 lzma_alloc(0xe8,(lzma_allocator *)block_local);
      if (local_30 == (_func_void_ptr_void_ptr_size_t_size_t *)0x0) {
        return LZMA_MEM_ERROR;
      }
      allocator_local->alloc = local_30;
      allocator_local[1].alloc = block_decode;
      allocator_local[1].free = block_decoder_end;
      __dest = local_30 + 8;
      memset(local_78,0,0x48);
      local_70 = 0xffffffffffffffff;
      memcpy(__dest,local_78,0x48);
    }
    *(undefined4 *)local_30 = 0;
    *(lzma_block_coder **)(local_30 + 0x50) = coder;
    *(undefined8 *)(local_30 + 0x58) = 0;
    *(undefined8 *)(local_30 + 0x60) = 0;
    if ((coder->next).id == 0xffffffffffffffff) {
      uVar2 = *(uint *)&coder->field_0x4;
      uVar3 = lzma_check_size(*(lzma_check *)&(coder->next).coder);
      local_88 = (0x7ffffffffffffffc - (ulong)uVar2) - (ulong)uVar3;
    }
    else {
      local_88 = (coder->next).id;
    }
    *(lzma_vli *)(local_30 + 0x68) = local_88;
    *(undefined8 *)(local_30 + 0x70) = 0;
    lzma_check_init((lzma_check_state *)(local_30 + 0x78),*(lzma_check *)&(coder->next).coder);
    if (coder->sequence == SEQ_CODE) {
      cVar1 = '\0';
    }
    else {
      cVar1 = *(char *)((long)&(coder->check).state + 0x10);
    }
    local_30[0xe0] = (_func_void_ptr_void_ptr_size_t_size_t)(cVar1 != '\0');
    next_local._4_4_ =
         lzma_raw_decoder_init
                   ((lzma_next_coder *)(local_30 + 8),(lzma_allocator *)block_local,
                    (lzma_filter *)(coder->next).code);
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_block_decoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		lzma_block *block)
{
	lzma_next_coder_init(&lzma_block_decoder_init, next, allocator);

	// Validate the options. lzma_block_unpadded_size() does that for us
	// except for Uncompressed Size and filters. Filters are validated
	// by the raw decoder.
	if (lzma_block_unpadded_size(block) == 0
			|| !lzma_vli_is_valid(block->uncompressed_size))
		return LZMA_PROG_ERROR;

	// Allocate *next->coder if needed.
	lzma_block_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_block_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &block_decode;
		next->end = &block_decoder_end;
		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Basic initializations
	coder->sequence = SEQ_CODE;
	coder->block = block;
	coder->compressed_size = 0;
	coder->uncompressed_size = 0;

	// If Compressed Size is not known, we calculate the maximum allowed
	// value so that encoded size of the Block (including Block Padding)
	// is still a valid VLI and a multiple of four.
	coder->compressed_limit
			= block->compressed_size == LZMA_VLI_UNKNOWN
				? (LZMA_VLI_MAX & ~LZMA_VLI_C(3))
					- block->header_size
					- lzma_check_size(block->check)
				: block->compressed_size;

	// Initialize the check. It's caller's problem if the Check ID is not
	// supported, and the Block decoder cannot verify the Check field.
	// Caller can test lzma_check_is_supported(block->check).
	coder->check_pos = 0;
	lzma_check_init(&coder->check, block->check);

	coder->ignore_check = block->version >= 1
			? block->ignore_check : false;

	// Initialize the filter chain.
	return lzma_raw_decoder_init(&coder->next, allocator,
			block->filters);
}